

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

void __thiscall duckdb::ColumnData::SetStart(ColumnData *this,idx_t new_start)

{
  long lVar1;
  ColumnSegment *segment;
  __pointer_type pCVar2;
  SegmentIterator SVar3;
  SegmentIterationHelper local_18;
  
  this->start = new_start;
  local_18.tree = &(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>;
  SVar3 = SegmentTree<duckdb::ColumnSegment,_false>::SegmentIterationHelper::begin(&local_18);
  lVar1 = 0;
  for (pCVar2 = SVar3.current; pCVar2 != (ColumnSegment *)0x0;
      pCVar2 = (pCVar2->super_SegmentBase<duckdb::ColumnSegment>).next._M_b._M_p) {
    (pCVar2->super_SegmentBase<duckdb::ColumnSegment>).start = this->start + lVar1;
    lVar1 = lVar1 + (pCVar2->super_SegmentBase<duckdb::ColumnSegment>).count.
                    super___atomic_base<unsigned_long>._M_i;
  }
  SegmentTree<duckdb::ColumnSegment,_false>::Reinitialize
            (&(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>);
  return;
}

Assistant:

void ColumnData::SetStart(idx_t new_start) {
	this->start = new_start;
	idx_t offset = 0;
	for (auto &segment : data.Segments()) {
		segment.start = start + offset;
		offset += segment.count;
	}
	data.Reinitialize();
}